

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ClientFeederApplication *this;
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  AppConfig config_storage;
  Logger<std::shared_ptr<spdlog::logger>_> logger;
  ClientFeederApplication *this_01;
  shared_ptr<spdlog::logger> *in_stack_fffffffffffffdd8;
  allocator<char> *config;
  Logger<std::shared_ptr<spdlog::logger>_> *in_stack_fffffffffffffde0;
  Logger<std::shared_ptr<spdlog::logger>_> *logger_00;
  allocator<char> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  AppConfig *in_stack_fffffffffffffe20;
  allocator<char> local_189;
  string local_188 [32];
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168;
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_160;
  element_type *in_stack_fffffffffffffeb8;
  ClientFeederApplication *in_stack_fffffffffffffef0;
  undefined1 local_b1 [56];
  allocator<char> local_79;
  string local_78 [48];
  ClientFeederApplication *local_48;
  ClientFeederApplication *local_40;
  int local_4;
  
  local_4 = 0;
  this = (ClientFeederApplication *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,
             (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe00);
  logger_00 = (Logger<std::shared_ptr<spdlog::logger>_> *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,
             (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe00);
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f);
  LogManager::Concretions::SpdLogger::SpdLogger
            ((SpdLogger *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  local_48 = this;
  local_40 = this;
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::Logger
            (in_stack_fffffffffffffde0,
             (ILogger<std::shared_ptr<spdlog::logger>_> **)in_stack_fffffffffffffdd8);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10ac34);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  this_00 = (Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  config = &local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,
             (char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe00);
  ConfigManager::Concretions::ReadConfigCfg::ReadConfigCfg
            ((ReadConfigCfg *)this,(string *)logger_00);
  this_01 = (ClientFeederApplication *)&stack0xfffffffffffffea8;
  local_168 = this_00;
  local_160 = this_00;
  ConfigManager::
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Reader
            (this_00,(IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)config,(Logger *)this_01);
  ConfigManager::
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ReadConfigurations((Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffeb8);
  ConfigManager::Configurations::AppConfig::AppConfig
            (in_stack_fffffffffffffe20,
             (map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe18);
  std::
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10ad41);
  ConfigManager::
  Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Reader
            ((Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  ClientFeederApplication::ClientFeederApplication(this,logger_00,(AppConfig *)this_00);
  local_4 = ClientFeederApplication::Start(in_stack_fffffffffffffef0);
  ClientFeederApplication::~ClientFeederApplication(this_01);
  ConfigManager::Configurations::AppConfig::~AppConfig((AppConfig *)0x10adb6);
  LogManager::Logger<std::shared_ptr<spdlog::logger>_>::~Logger(&this_01->m_logger);
  return local_4;
}

Assistant:

int main()
{
    auto logger = LogManager::Logger(
                std::move(new LogManager::Concretions::SpdLogger(
                              spdlog::basic_logger_mt("ApplicationLog", "Log/log.txt", true))));

    auto config_storage = ConfigManager::Configurations::AppConfig(
                ConfigManager::Reader(std::move(new ConfigManager::Concretions::ReadConfigCfg("Config")),
                                      logger)
                .ReadConfigurations());

    return ClientFeederApplication(logger, config_storage).Start();
}